

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionPdu.cpp
# Opt level: O1

bool __thiscall DIS::CollisionPdu::operator==(CollisionPdu *this,CollisionPdu *rhs)

{
  float fVar1;
  float fVar2;
  uchar uVar3;
  uchar uVar4;
  char cVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  
  bVar7 = EntityInformationFamilyPdu::operator==
                    (&this->super_EntityInformationFamilyPdu,&rhs->super_EntityInformationFamilyPdu)
  ;
  bVar8 = EntityID::operator==(&this->_issuingEntityID,&rhs->_issuingEntityID);
  bVar9 = EntityID::operator==(&this->_collidingEntityID,&rhs->_collidingEntityID);
  bVar10 = EventIdentifier::operator==(&this->_eventID,&rhs->_eventID);
  uVar3 = this->_collisionType;
  uVar4 = rhs->_collisionType;
  cVar5 = rhs->_pad;
  cVar6 = this->_pad;
  bVar11 = Vector3Float::operator==(&this->_velocity,&rhs->_velocity);
  fVar1 = this->_mass;
  fVar2 = rhs->_mass;
  bVar12 = Vector3Float::operator==(&this->_location,&rhs->_location);
  return ((bVar12 && cVar6 == cVar5) && (((bVar10 && bVar9) && (bVar8 && bVar7)) && uVar3 == uVar4))
         && (bVar11 && fVar1 == fVar2);
}

Assistant:

bool CollisionPdu::operator ==(const CollisionPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = EntityInformationFamilyPdu::operator==(rhs);

     if( ! (_issuingEntityID == rhs._issuingEntityID) ) ivarsEqual = false;
     if( ! (_collidingEntityID == rhs._collidingEntityID) ) ivarsEqual = false;
     if( ! (_eventID == rhs._eventID) ) ivarsEqual = false;
     if( ! (_collisionType == rhs._collisionType) ) ivarsEqual = false;
     if( ! (_pad == rhs._pad) ) ivarsEqual = false;
     if( ! (_velocity == rhs._velocity) ) ivarsEqual = false;
     if( ! (_mass == rhs._mass) ) ivarsEqual = false;
     if( ! (_location == rhs._location) ) ivarsEqual = false;

    return ivarsEqual;
 }